

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O2

bool __thiscall
SchemePrimitiveProcedure::is_eq(SchemePrimitiveProcedure *this,shared_ptr<SchemeObject> *a)

{
  __type_conflict _Var1;
  shared_ptr<SchemePrimitiveProcedure> p;
  shared_ptr<SchemeObject> local_20;
  
  std::dynamic_pointer_cast<SchemePrimitiveProcedure,SchemeObject>(&local_20);
  if (local_20.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    _Var1 = false;
  }
  else {
    _Var1 = std::operator==(&(this->super_SchemeProcedure).name,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_20.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 1));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return _Var1;
}

Assistant:

bool SchemePrimitiveProcedure::is_eq(const std::shared_ptr<SchemeObject> &a) const
{
    auto p = std::dynamic_pointer_cast<SchemePrimitiveProcedure>(a);
    return p && name == p->name;
}